

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptPromise.cpp
# Opt level: O0

Var Js::JavascriptPromise::EntryAllResolveElementFunction
              (RecyclableObject *function,CallInfo callInfo,...)

{
  code *pcVar1;
  bool bVar2;
  int n;
  CallFlags e;
  uint32 uVar3;
  ScriptContext *pSVar4;
  ThreadContext *this;
  Var *values_00;
  undefined4 *puVar5;
  JavascriptLibrary *this_00;
  CallInfo CVar6;
  JavascriptPromiseAllResolveElementFunction *this_01;
  JavascriptArray *value;
  JavascriptPromiseCapability *this_02;
  Var handler;
  JavascriptException *err;
  JavascriptExceptionObject *exception;
  JavascriptPromiseCapability *promiseCapability;
  JavascriptArray *values;
  uint32 index;
  JavascriptPromiseAllResolveElementFunction *allResolveElementFunction;
  Var x;
  Var undefinedVar;
  ScriptContext *scriptContext;
  ArgumentReader args;
  Var *_argsVarArray;
  RecyclableObject *function_local;
  CallInfo callInfo_local;
  
  function_local = (RecyclableObject *)callInfo;
  pSVar4 = RecyclableObject::GetScriptContext(function);
  this = ScriptContext::GetThreadContext(pSVar4);
  pSVar4 = RecyclableObject::GetScriptContext(function);
  ThreadContext::ProbeStack(this,0xc00,pSVar4,(PVOID)0x0);
  n = _count_args((CallInfo)function_local);
  values_00 = _get_va(&stack0x00000000,n);
  args.super_Arguments.Values = (Type)function_local;
  bVar2 = CallInfo::operator==((CallInfo *)(values_00 + -1),(CallInfo)function_local);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptPromise.cpp"
                                ,0x649,
                                "(*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo)",
                                "*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  ArgumentReader::ArgumentReader
            ((ArgumentReader *)&scriptContext,(CallInfo *)&function_local,values_00);
  e = Js::operator&((CallFlags)((ulong)function_local >> 0x18) &
                    (CallFlags_InternalFrame|CallFlags_NewTarget|CallFlags_Wrapped|CallFlags_NotUsed
                     |CallFlags_ExtraArg|CallFlags_Eval|CallFlags_Value|CallFlags_New),CallFlags_New
                   );
  bVar2 = operator!(e);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptPromise.cpp"
                                ,0x64a,"(!(callInfo.Flags & CallFlags_New))",
                                "!(callInfo.Flags & CallFlags_New)");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  pSVar4 = RecyclableObject::GetScriptContext(function);
  this_00 = ScriptContext::GetLibrary(pSVar4);
  CVar6 = (CallInfo)JavascriptLibraryBase::GetUndefined(&this_00->super_JavascriptLibraryBase);
  allResolveElementFunction = (JavascriptPromiseAllResolveElementFunction *)CVar6;
  if (((uint)scriptContext & 0xffffff) != 1 && ((ulong)scriptContext & 0xffffff) != 0) {
    allResolveElementFunction =
         (JavascriptPromiseAllResolveElementFunction *)
         Arguments::operator[]((Arguments *)&scriptContext,1);
  }
  this_01 = VarTo<Js::JavascriptPromiseAllResolveElementFunction,Js::RecyclableObject>(function);
  bVar2 = JavascriptPromiseAllResolveElementFunction::IsAlreadyCalled(this_01);
  callInfo_local = CVar6;
  if (!bVar2) {
    JavascriptPromiseAllResolveElementFunction::SetAlreadyCalled(this_01,true);
    uVar3 = JavascriptPromiseAllResolveElementFunction::GetIndex(this_01);
    value = JavascriptPromiseAllResolveElementFunction::GetValues(this_01);
    this_02 = JavascriptPromiseAllResolveElementFunction::GetCapabilities(this_01);
    (*(value->super_ArrayObject).super_DynamicObject.super_RecyclableObject.super_FinalizableObject.
      super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x29])
              (value,(ulong)uVar3,allResolveElementFunction,0);
    uVar3 = JavascriptPromiseAllResolveElementFunction::DecrementRemainingElements(this_01);
    if (uVar3 == 0) {
      handler = JavascriptPromiseCapability::GetResolve(this_02);
      callInfo_local = (CallInfo)TryCallResolveOrRejectHandler(handler,value,pSVar4);
    }
  }
  return (Var)callInfo_local;
}

Assistant:

Var JavascriptPromise::EntryAllResolveElementFunction(RecyclableObject* function, CallInfo callInfo, ...)
    {
        PROBE_STACK(function->GetScriptContext(), Js::Constants::MinStackDefault);
        ARGUMENTS(args, callInfo);
        Assert(!(callInfo.Flags & CallFlags_New));

        ScriptContext* scriptContext = function->GetScriptContext();
        Var undefinedVar = scriptContext->GetLibrary()->GetUndefined();
        Var x;

        if (args.Info.Count > 1)
        {
            x = args[1];
        }
        else
        {
            x = undefinedVar;
        }

        JavascriptPromiseAllResolveElementFunction* allResolveElementFunction = VarTo<JavascriptPromiseAllResolveElementFunction>(function);

        if (allResolveElementFunction->IsAlreadyCalled())
        {
            return undefinedVar;
        }

        allResolveElementFunction->SetAlreadyCalled(true);

        uint32 index = allResolveElementFunction->GetIndex();
        JavascriptArray* values = allResolveElementFunction->GetValues();
        JavascriptPromiseCapability* promiseCapability = allResolveElementFunction->GetCapabilities();
        JavascriptExceptionObject* exception = nullptr;

        try
        {
            values->SetItem(index, x, PropertyOperation_None);
        }
        catch (const JavascriptException& err)
        {
            exception = err.GetAndClear();
        }

        if (exception != nullptr)
        {
            return TryRejectWithExceptionObject(exception, promiseCapability->GetReject(), scriptContext);
        }

        if (allResolveElementFunction->DecrementRemainingElements() == 0)
        {
            return TryCallResolveOrRejectHandler(promiseCapability->GetResolve(), values, scriptContext);
        }

        return undefinedVar;
    }